

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall bpptr::incwch(bpptr *this)

{
  byte bVar1;
  ulong uVar2;
  uint ch;
  ulong uVar3;
  
  uVar2 = this->len;
  if (uVar2 != 0) {
    bVar1 = *this->p;
    uVar3 = (ulong)((((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
    if (uVar2 < uVar3) {
      uVar3 = uVar2;
    }
    this->p = this->p + uVar3;
    this->len = uVar2 - uVar3;
  }
  return;
}

Assistant:

void incwch()
    {
        if (len != 0)
        {
            size_t clen = utf8_ptr::s_charsize(*p);
            if (clen > len)
                clen = len;
            p += clen;
            len -= clen;
        }
    }